

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Select * sqlite3MultiValues(Parse *pParse,Select *pLeft,ExprList *pRow)

{
  anon_union_8_3_fafd40d6_for_u1 *paVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  long lVar4;
  SrcList *pSVar5;
  Subquery *pSVar6;
  ExprList *pRow_00;
  Select *pSVar7;
  char cVar8;
  u32 selFlags;
  int iVar9;
  Select *pSVar10;
  Vdbe *p;
  long lVar11;
  int p3;
  ExprList_item *pEVar12;
  SrcItem *pItem;
  long in_FS_OFFSET;
  SelectDest dest;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (((pParse->bHasWith == '\0') && ((pParse->db->init).busy == '\0')) &&
     (iVar9 = exprListIsConstant(pParse,pRow), iVar9 != 0)) {
    if (pLeft->pSrc->nSrc == 0) {
      pRow_00 = pLeft->pEList;
      iVar9 = exprListIsConstant(pParse,pRow_00);
      if (iVar9 == 0) goto LAB_0016a9fa;
      if (0 < pRow_00->nExpr) {
        pEVar12 = pRow_00->a;
        lVar11 = 0;
        do {
          cVar8 = sqlite3ExprAffinity(pEVar12->pExpr);
          if (cVar8 != '\0') goto LAB_0016a9fa;
          lVar11 = lVar11 + 1;
          pEVar12 = pEVar12 + 1;
        } while (lVar11 < pRow_00->nExpr);
      }
    }
    if (pParse->eParseMode == '\0') {
      pSVar5 = pLeft->pSrc;
      if (pSVar5->nSrc == 0) {
        p = sqlite3GetVdbe(pParse);
        pSVar10 = sqlite3SelectNew(pParse,(ExprList *)0x0,(SrcList *)0x0,(Expr *)0x0,(ExprList *)0x0
                                   ,(Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
        if ((pParse->db->mDbFlags & 0x10) == 0) {
          sqlite3ReadSchema(pParse);
        }
        if (pSVar10 == (Select *)0x0) {
          pItem = (SrcItem *)0x0;
          pSVar10 = pLeft;
        }
        else {
          dest.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          dest.nSdst = -0x55555556;
          dest._20_4_ = 0xaaaaaaaa;
          dest.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
          dest._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          dest.iSDParm2 = -0x55555556;
          dest.iSdst = -0x55555556;
          pSVar5 = pSVar10->pSrc;
          pSVar5->nSrc = 1;
          pSVar7 = pLeft->pPrior;
          pSVar10->pPrior = pSVar7;
          pSVar10->op = pLeft->op;
          if (pSVar7 != (Select *)0x0) {
            pbVar2 = (byte *)((long)&pSVar10->selFlags + 1);
            *pbVar2 = *pbVar2 | 2;
          }
          pLeft->pPrior = (Select *)0x0;
          pLeft->op = 0x8b;
          puVar3 = &pSVar5->a[0].fg.field_0x1;
          *puVar3 = *puVar3 | 0x40;
          pItem = pSVar5->a;
          pSVar5->a[0].iCursor = -1;
          pSVar5->a[0].u1.nRow = 2;
          iVar9 = sqlite3SrcItemAttachSubquery(pParse,pItem,pLeft,0);
          if (iVar9 != 0) {
            pSVar6 = pSVar5->a[0].u4.pSubq;
            p3 = p->nOp + 1;
            pSVar6->addrFillSub = p3;
            iVar9 = pParse->nMem + 1;
            pParse->nMem = iVar9;
            pSVar6->regReturn = iVar9;
            sqlite3VdbeAddOp3(p,0xb,iVar9,0,p3);
            dest.eDest = '\r';
            dest.iSDParm = pSVar6->regReturn;
            dest.iSDParm2 = 0;
            dest.zAffSdst = (char *)0x0;
            dest.iSdst = pParse->nMem + 3;
            dest.nSdst = pLeft->pEList->nExpr;
            pParse->nMem = pParse->nMem + dest.nSdst + 2;
            pbVar2 = (byte *)((long)&pLeft->selFlags + 1);
            *pbVar2 = *pbVar2 | 4;
            sqlite3Select(pParse,pLeft,&dest);
            pSVar6->regResult = dest.iSdst;
          }
        }
      }
      else {
        paVar1 = &pSVar5->a[0].u1;
        paVar1->nRow = paVar1->nRow + 1;
        pItem = pSVar5->a;
        pSVar10 = pLeft;
      }
      if (pParse->nErr == 0) {
        pSVar6 = (pItem->u4).pSubq;
        if (pSVar6->pSelect->pEList->nExpr == pRow->nExpr) {
          sqlite3ExprCodeExprList(pParse,pRow,pSVar6->regResult,0,'\0');
          sqlite3VdbeAddOp3(pParse->pVdbe,0xc,pSVar6->regReturn,0,0);
        }
        else {
          sqlite3SelectWrongNumTermsError(pParse,pSVar6->pSelect);
        }
      }
      pLeft = pSVar10;
      if (pRow != (ExprList *)0x0) {
        exprListDeleteNN(pParse->db,pRow);
      }
      goto LAB_0016ab04;
    }
  }
LAB_0016a9fa:
  if (pLeft->pSrc->nSrc == 0) {
    if (pLeft->pPrior == (Select *)0x0) {
      selFlags = 0x600;
    }
    else {
      selFlags = pLeft->selFlags & 0x600;
    }
  }
  else {
    sqlite3MultiValuesEnd(pParse,pLeft);
    selFlags = 0x200;
  }
  pSVar10 = sqlite3SelectNew(pParse,pRow,(SrcList *)0x0,(Expr *)0x0,(ExprList *)0x0,(Expr *)0x0,
                             (ExprList *)0x0,selFlags,(Expr *)0x0);
  pbVar2 = (byte *)((long)&pLeft->selFlags + 1);
  *pbVar2 = *pbVar2 & 0xfb;
  if (pSVar10 != (Select *)0x0) {
    pSVar10->op = 0x88;
    pSVar10->pPrior = pLeft;
    pLeft = pSVar10;
  }
LAB_0016ab04:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return pLeft;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3MultiValues(Parse *pParse, Select *pLeft, ExprList *pRow){

  if( pParse->bHasWith                   /* condition (a) above */
   || pParse->db->init.busy              /* condition (b) above */
   || exprListIsConstant(pParse,pRow)==0 /* condition (c) above */
   || (pLeft->pSrc->nSrc==0 &&
       exprListIsNoAffinity(pParse,pLeft->pEList)==0) /* condition (d) above */
   || IN_SPECIAL_PARSE
  ){
    /* The co-routine method cannot be used. Fall back to UNION ALL. */
    Select *pSelect = 0;
    int f = SF_Values | SF_MultiValue;
    if( pLeft->pSrc->nSrc ){
      sqlite3MultiValuesEnd(pParse, pLeft);
      f = SF_Values;
    }else if( pLeft->pPrior ){
      /* In this case set the SF_MultiValue flag only if it was set on pLeft */
      f = (f & pLeft->selFlags);
    }
    pSelect = sqlite3SelectNew(pParse, pRow, 0, 0, 0, 0, 0, f, 0);
    pLeft->selFlags &= ~SF_MultiValue;
    if( pSelect ){
      pSelect->op = TK_ALL;
      pSelect->pPrior = pLeft;
      pLeft = pSelect;
    }
  }else{
    SrcItem *p = 0;               /* SrcItem that reads from co-routine */

    if( pLeft->pSrc->nSrc==0 ){
      /* Co-routine has not yet been started and the special Select object
      ** that accesses the co-routine has not yet been created. This block
      ** does both those things. */
      Vdbe *v = sqlite3GetVdbe(pParse);
      Select *pRet = sqlite3SelectNew(pParse, 0, 0, 0, 0, 0, 0, 0, 0);

      /* Ensure the database schema has been read. This is to ensure we have
      ** the correct text encoding.  */
      if( (pParse->db->mDbFlags & DBFLAG_SchemaKnownOk)==0 ){
        sqlite3ReadSchema(pParse);
      }

      if( pRet ){
        SelectDest dest;
        Subquery *pSubq;
        pRet->pSrc->nSrc = 1;
        pRet->pPrior = pLeft->pPrior;
        pRet->op = pLeft->op;
        if( pRet->pPrior ) pRet->selFlags |= SF_Values;
        pLeft->pPrior = 0;
        pLeft->op = TK_SELECT;
        assert( pLeft->pNext==0 );
        assert( pRet->pNext==0 );
        p = &pRet->pSrc->a[0];
        p->fg.viaCoroutine = 1;
        p->iCursor = -1;
        assert( !p->fg.isIndexedBy && !p->fg.isTabFunc );
        p->u1.nRow = 2;
        if( sqlite3SrcItemAttachSubquery(pParse, p, pLeft, 0) ){
          pSubq = p->u4.pSubq;
          pSubq->addrFillSub = sqlite3VdbeCurrentAddr(v) + 1;
          pSubq->regReturn = ++pParse->nMem;
          sqlite3VdbeAddOp3(v, OP_InitCoroutine,
                            pSubq->regReturn, 0, pSubq->addrFillSub);
          sqlite3SelectDestInit(&dest, SRT_Coroutine, pSubq->regReturn);

          /* Allocate registers for the output of the co-routine. Do so so
          ** that there are two unused registers immediately before those
          ** used by the co-routine. This allows the code in sqlite3Insert()
          ** to use these registers directly, instead of copying the output
          ** of the co-routine to a separate array for processing.  */
          dest.iSdst = pParse->nMem + 3;
          dest.nSdst = pLeft->pEList->nExpr;
          pParse->nMem += 2 + dest.nSdst;

          pLeft->selFlags |= SF_MultiValue;
          sqlite3Select(pParse, pLeft, &dest);
          pSubq->regResult = dest.iSdst;
          assert( pParse->nErr || dest.iSdst>0 );
        }
        pLeft = pRet;
      }
    }else{
      p = &pLeft->pSrc->a[0];
      assert( !p->fg.isTabFunc && !p->fg.isIndexedBy );
      p->u1.nRow++;
    }

    if( pParse->nErr==0 ){
      Subquery *pSubq;
      assert( p!=0 );
      assert( p->fg.isSubquery );
      pSubq = p->u4.pSubq;
      assert( pSubq!=0 );
      assert( pSubq->pSelect!=0 );
      assert( pSubq->pSelect->pEList!=0 );
      if( pSubq->pSelect->pEList->nExpr!=pRow->nExpr ){
        sqlite3SelectWrongNumTermsError(pParse, pSubq->pSelect);
      }else{
        sqlite3ExprCodeExprList(pParse, pRow, pSubq->regResult, 0, 0);
        sqlite3VdbeAddOp1(pParse->pVdbe, OP_Yield, pSubq->regReturn);
      }
    }
    sqlite3ExprListDelete(pParse->db, pRow);
  }

  return pLeft;
}